

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_interface.c
# Opt level: O0

void dlep_if_remove(dlep_if *interface)

{
  list_entity *plVar1;
  list_entity *plVar2;
  avl_tree *paVar3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  dlep_extension *ext;
  dlep_if *interface_local;
  
  if ((log_global_mask[(interface->session).log_source] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,(interface->session).log_source,"src/generic/dlep/dlep_interface.c",
             0x94,(void *)0x0,0,"remove session %s",interface->l2_ifname);
  }
  paVar3 = dlep_extension_get_tree();
  for (plVar1 = (paVar3->list_head).next; plVar2 = plVar1->prev, paVar3 = dlep_extension_get_tree(),
      plVar2 != (paVar3->list_head).prev; plVar1 = plVar1->next) {
    if (((interface->session).radio & 1U) == 0) {
      if (plVar1[-1].prev != (list_entity *)0x0) {
        (*(code *)plVar1[-1].prev)(interface);
      }
    }
    else if (plVar1[-1].next != (list_entity *)0x0) {
      (*(code *)plVar1[-1].next)(interface);
    }
  }
  paVar3 = dlep_if_get_tree((_Bool)(interface->radio & 1));
  avl_remove(paVar3,&interface->_node);
  oonf_packet_remove_managed(&interface->udp,true);
  dlep_session_remove(&interface->session);
  oonf_packet_free_managed_config(&interface->udp_config);
  abuf_free(&interface->udp_out);
  return;
}

Assistant:

void
dlep_if_remove(struct dlep_if *interface) {
  struct dlep_extension *ext;

  OONF_DEBUG(interface->session.log_source, "remove session %s", interface->l2_ifname);

  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (interface->session.radio) {
      if (ext->cb_session_cleanup_radio) {
        ext->cb_session_cleanup_radio(&interface->session);
      }
    }
    else {
      if (ext->cb_session_cleanup_router) {
        ext->cb_session_cleanup_router(&interface->session);
      }
    }
  }

  /* remove from tree */
  avl_remove(dlep_if_get_tree(interface->radio), &interface->_node);

  /* close UDP interface */
  oonf_packet_remove_managed(&interface->udp, true);

  /* kill dlep session */
  dlep_session_remove(&interface->session);

  /* free allocated memory data */
  oonf_packet_free_managed_config(&interface->udp_config);
  abuf_free(&interface->udp_out);
}